

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

void ma_pcm_f32_to_s16(void *dst,void *src,ma_uint64 count,ma_dither_mode ditherMode)

{
  int iVar1;
  float local_518;
  float local_514;
  float local_50c;
  float local_508;
  float local_504;
  float local_500;
  float local_4fc;
  float local_4f8;
  float local_4f4;
  float local_4f0;
  ma_dither_mode ditherMode_local;
  ma_uint64 count_local;
  void *src_local;
  void *dst_local;
  float x;
  float x3;
  float x2;
  float x1;
  float x0;
  float d3;
  float d2;
  float d1;
  float d0;
  float ditherMax;
  float ditherMin;
  float *src_f32;
  ma_int16 *dst_s16;
  ma_uint64 count4;
  ma_uint64 i4;
  ma_uint64 i;
  float local_44c;
  float local_43c;
  float local_42c;
  float local_41c;
  float local_40c;
  float b;
  float a;
  float b_1;
  float a_1;
  float b_2;
  float a_2;
  float b_3;
  float a_3;
  float b_4;
  float a_4;
  
  d0 = 0.0;
  d1 = 0.0;
  if (ditherMode != ma_dither_mode_none) {
    d0 = -3.0517578e-05;
    d1 = 3.051851e-05;
  }
  i4 = 0;
  for (count4 = 0; count4 < count >> 2; count4 = count4 + 1) {
    if (ditherMode == ma_dither_mode_rectangle) {
      g_maLCG.state = (g_maLCG.state * 0xbc8f) % 0x7fffffff;
      local_40c = ((float)g_maLCG.state / 2.1474836e+09) * (d1 - d0) + d0;
    }
    else if (ditherMode == ma_dither_mode_triangle) {
      iVar1 = (g_maLCG.state * 0xbc8f) % 0x7fffffff;
      g_maLCG.state = (iVar1 * 0xbc8f) % 0x7fffffff;
      local_40c = ((float)iVar1 / 2.1474836e+09) * (0.0 - d0) + d0 +
                  ((float)g_maLCG.state / 2.1474836e+09) * (d1 - 0.0) + 0.0;
    }
    else {
      local_40c = 0.0;
    }
    if (ditherMode == ma_dither_mode_rectangle) {
      g_maLCG.state = (g_maLCG.state * 0xbc8f) % 0x7fffffff;
      local_41c = ((float)g_maLCG.state / 2.1474836e+09) * (d1 - d0) + d0;
    }
    else if (ditherMode == ma_dither_mode_triangle) {
      iVar1 = (g_maLCG.state * 0xbc8f) % 0x7fffffff;
      g_maLCG.state = (iVar1 * 0xbc8f) % 0x7fffffff;
      local_41c = ((float)iVar1 / 2.1474836e+09) * (0.0 - d0) + d0 +
                  ((float)g_maLCG.state / 2.1474836e+09) * (d1 - 0.0) + 0.0;
    }
    else {
      local_41c = 0.0;
    }
    if (ditherMode == ma_dither_mode_rectangle) {
      g_maLCG.state = (g_maLCG.state * 0xbc8f) % 0x7fffffff;
      local_42c = ((float)g_maLCG.state / 2.1474836e+09) * (d1 - d0) + d0;
    }
    else if (ditherMode == ma_dither_mode_triangle) {
      iVar1 = (g_maLCG.state * 0xbc8f) % 0x7fffffff;
      g_maLCG.state = (iVar1 * 0xbc8f) % 0x7fffffff;
      local_42c = ((float)iVar1 / 2.1474836e+09) * (0.0 - d0) + d0 +
                  ((float)g_maLCG.state / 2.1474836e+09) * (d1 - 0.0) + 0.0;
    }
    else {
      local_42c = 0.0;
    }
    if (ditherMode == ma_dither_mode_rectangle) {
      g_maLCG.state = (g_maLCG.state * 0xbc8f) % 0x7fffffff;
      local_43c = ((float)g_maLCG.state / 2.1474836e+09) * (d1 - d0) + d0;
    }
    else if (ditherMode == ma_dither_mode_triangle) {
      iVar1 = (g_maLCG.state * 0xbc8f) % 0x7fffffff;
      g_maLCG.state = (iVar1 * 0xbc8f) % 0x7fffffff;
      local_43c = ((float)iVar1 / 2.1474836e+09) * (0.0 - d0) + d0 +
                  ((float)g_maLCG.state / 2.1474836e+09) * (d1 - 0.0) + 0.0;
    }
    else {
      local_43c = 0.0;
    }
    local_4f4 = *(float *)((long)src + i4 * 4) + local_40c;
    local_4fc = *(float *)((long)src + i4 * 4 + 4) + local_41c;
    local_504 = *(float *)((long)src + i4 * 4 + 8) + local_42c;
    local_50c = *(float *)((long)src + i4 * 4 + 0xc) + local_43c;
    if (-1.0 <= local_4f4) {
      if (1.0 < local_4f4) {
        local_4f4 = 1.0;
      }
      local_4f0 = local_4f4;
    }
    else {
      local_4f0 = -1.0;
    }
    if (-1.0 <= local_4fc) {
      if (1.0 < local_4fc) {
        local_4fc = 1.0;
      }
      local_4f8 = local_4fc;
    }
    else {
      local_4f8 = -1.0;
    }
    if (-1.0 <= local_504) {
      if (1.0 < local_504) {
        local_504 = 1.0;
      }
      local_500 = local_504;
    }
    else {
      local_500 = -1.0;
    }
    if (-1.0 <= local_50c) {
      if (1.0 < local_50c) {
        local_50c = 1.0;
      }
      local_508 = local_50c;
    }
    else {
      local_508 = -1.0;
    }
    *(short *)((long)dst + i4 * 2) = (short)(int)(local_4f0 * 32767.0);
    *(short *)((long)dst + i4 * 2 + 2) = (short)(int)(local_4f8 * 32767.0);
    *(short *)((long)dst + i4 * 2 + 4) = (short)(int)(local_500 * 32767.0);
    *(short *)((long)dst + i4 * 2 + 6) = (short)(int)(local_508 * 32767.0);
    i4 = i4 + 4;
  }
  for (; i4 < count; i4 = i4 + 1) {
    if (ditherMode == ma_dither_mode_rectangle) {
      g_maLCG.state = (g_maLCG.state * 0xbc8f) % 0x7fffffff;
      local_44c = ((float)g_maLCG.state / 2.1474836e+09) * (d1 - d0) + d0;
    }
    else if (ditherMode == ma_dither_mode_triangle) {
      iVar1 = (g_maLCG.state * 0xbc8f) % 0x7fffffff;
      g_maLCG.state = (iVar1 * 0xbc8f) % 0x7fffffff;
      local_44c = ((float)iVar1 / 2.1474836e+09) * (0.0 - d0) + d0 +
                  ((float)g_maLCG.state / 2.1474836e+09) * (d1 - 0.0) + 0.0;
    }
    else {
      local_44c = 0.0;
    }
    local_518 = *(float *)((long)src + i4 * 4) + local_44c;
    if (-1.0 <= local_518) {
      if (1.0 < local_518) {
        local_518 = 1.0;
      }
      local_514 = local_518;
    }
    else {
      local_514 = -1.0;
    }
    *(short *)((long)dst + i4 * 2) = (short)(int)(local_514 * 32767.0);
  }
  return;
}

Assistant:

MA_API void ma_pcm_f32_to_s16(void* dst, const void* src, ma_uint64 count, ma_dither_mode ditherMode)
{
#ifdef MA_USE_REFERENCE_CONVERSION_APIS
    ma_pcm_f32_to_s16__reference(dst, src, count, ditherMode);
#else
    #  if MA_PREFERRED_SIMD == MA_SIMD_AVX2
        if (ma_has_avx2()) {
            ma_pcm_f32_to_s16__avx2(dst, src, count, ditherMode);
        } else
    #elif MA_PREFERRED_SIMD == MA_SIMD_SSE2
        if (ma_has_sse2()) {
            ma_pcm_f32_to_s16__sse2(dst, src, count, ditherMode);
        } else
    #elif MA_PREFERRED_SIMD == MA_SIMD_NEON
        if (ma_has_neon()) {
            ma_pcm_f32_to_s16__neon(dst, src, count, ditherMode);
        } else
    #endif
        {
            ma_pcm_f32_to_s16__optimized(dst, src, count, ditherMode);
        }
#endif
}